

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inet.c
# Opt level: O0

int uv_inet_ntop(int af,void *src,char *dst,size_t size)

{
  int in_EDI;
  char *unaff_retaddr;
  size_t in_stack_00000058;
  char *in_stack_00000060;
  uchar *in_stack_00000068;
  undefined4 in_stack_fffffffffffffffc;
  int iVar1;
  
  if (in_EDI == 2) {
    iVar1 = inet_ntop4((uchar *)size,unaff_retaddr,CONCAT44(in_stack_fffffffffffffffc,2));
  }
  else if (in_EDI == 10) {
    iVar1 = inet_ntop6(in_stack_00000068,in_stack_00000060,in_stack_00000058);
  }
  else {
    iVar1 = -0x61;
  }
  return iVar1;
}

Assistant:

int uv_inet_ntop(int af, const void* src, char* dst, size_t size) {
  switch (af) {
  case AF_INET:
    return (inet_ntop4(src, dst, size));
  case AF_INET6:
    return (inet_ntop6(src, dst, size));
  default:
    return UV_EAFNOSUPPORT;
  }
  /* NOTREACHED */
}